

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node,char *data,int datalen,int options,xmlNodePtr *lst)

{
  xmlChar xVar1;
  xmlElementType xVar2;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlCharEncodingHandlerPtr handler;
  xmlNodePtr cur;
  _xmlDoc *p_Var4;
  xmlChar *URL;
  xmlChar *pxVar5;
  _xmlNode *p_Var6;
  xmlNs *pxVar7;
  xmlParserErrors xVar8;
  int nr;
  _xmlDoc *p_Var9;
  
  if (datalen < 0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (data == (char *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (node == (xmlNodePtr)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (lst == (xmlNodePtr *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (XML_HTML_DOCUMENT_NODE < node->type) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if ((0x23beU >> (node->type & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  while( true ) {
    if (node == (xmlNodePtr)0x0) {
      return XML_ERR_INTERNAL_ERROR;
    }
    xVar2 = ((_xmlDoc *)node)->type;
    if (xVar2 == XML_ELEMENT_NODE) break;
    p_Var9 = (_xmlDoc *)node;
    if ((xVar2 == XML_DOCUMENT_NODE) || (xVar2 == XML_HTML_DOCUMENT_NODE)) goto LAB_0016610d;
    node = ((_xmlDoc *)node)->parent;
  }
  p_Var9 = ((_xmlDoc *)node)->doc;
LAB_0016610d:
  if (p_Var9 == (_xmlDoc *)0x0) {
    return XML_ERR_INTERNAL_ERROR;
  }
  if (p_Var9->type == XML_HTML_DOCUMENT_NODE) {
    ctxt = htmlCreateMemoryParserCtxt(data,datalen);
    options = options | 0x2000;
  }
  else {
    if (p_Var9->type != XML_DOCUMENT_NODE) {
      return XML_ERR_INTERNAL_ERROR;
    }
    ctxt = xmlCreateMemoryParserCtxt(data,datalen);
  }
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return XML_ERR_NO_MEMORY;
  }
  if (p_Var9->dict == (_xmlDict *)0x0) {
    options = options | 0x1000;
  }
  else {
    if (ctxt->dict != (xmlDictPtr)0x0) {
      xmlDictFree(ctxt->dict);
    }
    ctxt->dict = p_Var9->dict;
  }
  if (p_Var9->encoding != (xmlChar *)0x0) {
    if (ctxt->encoding != (xmlChar *)0x0) {
      (*xmlFree)(ctxt->encoding);
    }
    pxVar3 = xmlStrdup(p_Var9->encoding);
    ctxt->encoding = pxVar3;
    handler = xmlFindCharEncodingHandler((char *)p_Var9->encoding);
    if (handler == (xmlCharEncodingHandlerPtr)0x0) {
      return XML_ERR_UNSUPPORTED_ENCODING;
    }
    xmlSwitchToEncoding(ctxt,handler);
  }
  nr = 0;
  xmlCtxtUseOptionsInternal(ctxt,options,(char *)0x0);
  xmlDetectSAX2(ctxt);
  ctxt->myDoc = p_Var9;
  ctxt->input_id = 2;
  ctxt->instate = XML_PARSER_CONTENT;
  cur = xmlNewDocComment(((_xmlDoc *)node)->doc,(xmlChar *)0x0);
  if (cur == (xmlNodePtr)0x0) {
    xVar8 = XML_ERR_NO_MEMORY;
  }
  else {
    xmlAddChild(node,cur);
    if (((_xmlDoc *)node)->type == XML_ELEMENT_NODE) {
      nodePush(ctxt,node);
      nr = 0;
      p_Var4 = (_xmlDoc *)node;
      do {
        if (((xmlNodePtr)p_Var4)->type != XML_ELEMENT_NODE) break;
        for (pxVar7 = ((xmlNodePtr)p_Var4)->nsDef; pxVar7 != (xmlNs *)0x0; pxVar7 = pxVar7->next) {
          pxVar3 = pxVar7->prefix;
          if (ctxt->dict == (xmlDictPtr)0x0) {
            URL = pxVar7->href;
          }
          else {
            pxVar3 = xmlDictLookup(ctxt->dict,pxVar3,-1);
            URL = xmlDictLookup(ctxt->dict,pxVar7->href,-1);
          }
          pxVar5 = xmlGetNamespace(ctxt,pxVar3);
          if (pxVar5 == (xmlChar *)0x0) {
            nsPush(ctxt,pxVar3,URL);
            nr = nr + 1;
          }
        }
        p_Var4 = (_xmlDoc *)((xmlNodePtr)p_Var4)->parent;
      } while (p_Var4 != (_xmlDoc *)0x0);
    }
    if ((ctxt->validate != 0) || (ctxt->replaceEntities != 0)) {
      *(byte *)&ctxt->loadsubset = (byte)ctxt->loadsubset | 8;
    }
    if (p_Var9->type == XML_HTML_DOCUMENT_NODE) {
      __htmlParseContent(ctxt);
    }
    else {
      xmlParseContent(ctxt);
    }
    nsPop(ctxt,nr);
    pxVar3 = ctxt->input->cur;
    xVar1 = *pxVar3;
    if (xVar1 != '\0') {
      xVar8 = XML_ERR_EXTRA_CONTENT;
      if ((xVar1 == '<') && (xVar8 = XML_ERR_NOT_WELL_BALANCED, pxVar3[1] != '/')) {
        xVar8 = XML_ERR_EXTRA_CONTENT;
      }
      xmlFatalErr(ctxt,xVar8,(char *)0x0);
    }
    if (ctxt->node != node && ctxt->node != (xmlNodePtr)0x0) {
      xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
      ctxt->wellFormed = 0;
    }
    xVar8 = XML_ERR_OK;
    if (ctxt->wellFormed == 0) {
      xVar8 = ctxt->errNo + (uint)(ctxt->errNo == 0);
    }
    p_Var6 = cur->next;
    cur->next = (_xmlNode *)0x0;
    ((_xmlDoc *)node)->last = cur;
    if (p_Var6 != (_xmlNode *)0x0) {
      p_Var6->prev = (_xmlNode *)0x0;
    }
    *lst = p_Var6;
    for (; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
      p_Var6->parent = (_xmlNode *)0x0;
    }
    xmlUnlinkNode(cur);
    xmlFreeNode(cur);
    if (xVar8 != XML_ERR_OK) {
      xmlFreeNodeList(*lst);
      *lst = (xmlNodePtr)0x0;
    }
    if (p_Var9->dict != (_xmlDict *)0x0) {
      ctxt->dict = (xmlDictPtr)0x0;
    }
  }
  xmlFreeParserCtxt(ctxt);
  return xVar8;
}

Assistant:

xmlParserErrors
xmlParseInNodeContext(xmlNodePtr node, const char *data, int datalen,
                      int options, xmlNodePtr *lst) {
#ifdef SAX2
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc = NULL;
    xmlNodePtr fake, cur;
    int nsnr = 0;

    xmlParserErrors ret = XML_ERR_OK;

    /*
     * check all input parameters, grab the document
     */
    if ((lst == NULL) || (node == NULL) || (data == NULL) || (datalen < 0))
        return(XML_ERR_INTERNAL_ERROR);
    switch (node->type) {
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    break;
	default:
	    return(XML_ERR_INTERNAL_ERROR);

    }
    while ((node != NULL) && (node->type != XML_ELEMENT_NODE) &&
           (node->type != XML_DOCUMENT_NODE) &&
	   (node->type != XML_HTML_DOCUMENT_NODE))
	node = node->parent;
    if (node == NULL)
	return(XML_ERR_INTERNAL_ERROR);
    if (node->type == XML_ELEMENT_NODE)
	doc = node->doc;
    else
        doc = (xmlDocPtr) node;
    if (doc == NULL)
	return(XML_ERR_INTERNAL_ERROR);

    /*
     * allocate a context and set-up everything not related to the
     * node position in the tree
     */
    if (doc->type == XML_DOCUMENT_NODE)
	ctxt = xmlCreateMemoryParserCtxt((char *) data, datalen);
#ifdef LIBXML_HTML_ENABLED
    else if (doc->type == XML_HTML_DOCUMENT_NODE) {
	ctxt = htmlCreateMemoryParserCtxt((char *) data, datalen);
        /*
         * When parsing in context, it makes no sense to add implied
         * elements like html/body/etc...
         */
        options |= HTML_PARSE_NOIMPLIED;
    }
#endif
    else
        return(XML_ERR_INTERNAL_ERROR);

    if (ctxt == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Use input doc's dict if present, else assure XML_PARSE_NODICT is set.
     * We need a dictionary for xmlDetectSAX2, so if there's no doc dict
     * we must wait until the last moment to free the original one.
     */
    if (doc->dict != NULL) {
        if (ctxt->dict != NULL)
	    xmlDictFree(ctxt->dict);
	ctxt->dict = doc->dict;
    } else
        options |= XML_PARSE_NODICT;

    if (doc->encoding != NULL) {
        xmlCharEncodingHandlerPtr hdlr;

        if (ctxt->encoding != NULL)
	    xmlFree((xmlChar *) ctxt->encoding);
        ctxt->encoding = xmlStrdup((const xmlChar *) doc->encoding);

        hdlr = xmlFindCharEncodingHandler((const char *) doc->encoding);
        if (hdlr != NULL) {
            xmlSwitchToEncoding(ctxt, hdlr);
	} else {
            return(XML_ERR_UNSUPPORTED_ENCODING);
        }
    }

    xmlCtxtUseOptionsInternal(ctxt, options, NULL);
    xmlDetectSAX2(ctxt);
    ctxt->myDoc = doc;
    /* parsing in context, i.e. as within existing content */
    ctxt->input_id = 2;
    ctxt->instate = XML_PARSER_CONTENT;

    fake = xmlNewDocComment(node->doc, NULL);
    if (fake == NULL) {
        xmlFreeParserCtxt(ctxt);
	return(XML_ERR_NO_MEMORY);
    }
    xmlAddChild(node, fake);

    if (node->type == XML_ELEMENT_NODE) {
	nodePush(ctxt, node);
	/*
	 * initialize the SAX2 namespaces stack
	 */
	cur = node;
	while ((cur != NULL) && (cur->type == XML_ELEMENT_NODE)) {
	    xmlNsPtr ns = cur->nsDef;
	    const xmlChar *iprefix, *ihref;

	    while (ns != NULL) {
		if (ctxt->dict) {
		    iprefix = xmlDictLookup(ctxt->dict, ns->prefix, -1);
		    ihref = xmlDictLookup(ctxt->dict, ns->href, -1);
		} else {
		    iprefix = ns->prefix;
		    ihref = ns->href;
		}

	        if (xmlGetNamespace(ctxt, iprefix) == NULL) {
		    nsPush(ctxt, iprefix, ihref);
		    nsnr++;
		}
		ns = ns->next;
	    }
	    cur = cur->parent;
	}
    }

    if ((ctxt->validate) || (ctxt->replaceEntities != 0)) {
	/*
	 * ID/IDREF registration will be done in xmlValidateElement below
	 */
	ctxt->loadsubset |= XML_SKIP_IDS;
    }

#ifdef LIBXML_HTML_ENABLED
    if (doc->type == XML_HTML_DOCUMENT_NODE)
        __htmlParseContent(ctxt);
    else
#endif
	xmlParseContent(ctxt);

    nsPop(ctxt, nsnr);
    if ((RAW == '<') && (NXT(1) == '/')) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
    } else if (RAW != 0) {
	xmlFatalErr(ctxt, XML_ERR_EXTRA_CONTENT, NULL);
    }
    if ((ctxt->node != NULL) && (ctxt->node != node)) {
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
	ctxt->wellFormed = 0;
    }

    if (!ctxt->wellFormed) {
        if (ctxt->errNo == 0)
	    ret = XML_ERR_INTERNAL_ERROR;
	else
	    ret = (xmlParserErrors)ctxt->errNo;
    } else {
        ret = XML_ERR_OK;
    }

    /*
     * Return the newly created nodeset after unlinking it from
     * the pseudo sibling.
     */

    cur = fake->next;
    fake->next = NULL;
    node->last = fake;

    if (cur != NULL) {
	cur->prev = NULL;
    }

    *lst = cur;

    while (cur != NULL) {
	cur->parent = NULL;
	cur = cur->next;
    }

    xmlUnlinkNode(fake);
    xmlFreeNode(fake);


    if (ret != XML_ERR_OK) {
        xmlFreeNodeList(*lst);
	*lst = NULL;
    }

    if (doc->dict != NULL)
        ctxt->dict = NULL;
    xmlFreeParserCtxt(ctxt);

    return(ret);
#else /* !SAX2 */
    return(XML_ERR_INTERNAL_ERROR);
#endif
}